

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O1

bool __thiscall QMYSQLResult::isNull(QMYSQLResult *this,int field)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = true;
  if (-1 < field) {
    lVar1 = *(long *)&this->field_0x8;
    uVar2 = (ulong)(uint)field;
    if (uVar2 < *(ulong *)(lVar1 + 0xd0)) {
      if (*(char *)(lVar1 + 0xfd) == '\x01') {
        return (bool)*(undefined1 *)(*(long *)(lVar1 + 200) + 0x18 + uVar2 * 0x28);
      }
      bVar3 = *(long *)(*(long *)(lVar1 + 0xb8) + uVar2 * 8) == 0;
    }
  }
  return bVar3;
}

Assistant:

bool QMYSQLResult::isNull(int field)
{
   Q_D(const QMYSQLResult);
   if (field < 0 || field >= d->fields.size())
       return true;
   if (d->preparedQuery)
       return d->fields.at(field).nullIndicator;
   else
       return d->row[field] == nullptr;
}